

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void sysbvm_dictionary_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).dictionaryType,"add:",2,0x24,(void *)0x0,
             sysbvm_dictionary_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).dictionaryType,"atOrNil:",2,0x24,(void *)0x0,
             sysbvm_dictionary_primitive_atOrNil);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).dictionaryType,"at:put:",3,0x24,(void *)0x0,
             sysbvm_dictionary_primitive_atPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).dictionaryType,"at:",2,0x24,(void *)0x0,
             sysbvm_dictionary_primitive_at);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).dictionaryType,"scanFor:",2,0x24,(void *)0x0,
             sysbvm_dictionary_primitive_scanFor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).identityDictionaryType,"add:",2,0x84,(void *)0x0,
             sysbvm_identityDictionary_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).identityDictionaryType,"associationAtOrNil:",2,0x84,
             (void *)0x0,sysbvm_identityDictionary_primitive_associationAtOrNil);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).identityDictionaryType,"atOrNil:",2,0x84,(void *)0x0,
             sysbvm_identityDictionary_primitive_atOrNil);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).identityDictionaryType,"at:put:",3,0x84,(void *)0x0,
             sysbvm_identityDictionary_primitive_atPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).identityDictionaryType,"at:",2,0x84,(void *)0x0,
             sysbvm_identityDictionary_primitive_at);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).identityDictionaryType,"scanFor:",2,0x84,(void *)0x0,
             sysbvm_identityDictionary_primitive_scanFor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).weakValueDictionaryType,"atOrNil:",2,0x84,(void *)0x0,
             sysbvm_weakValueDictionary_primitive_atOrNil);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).weakValueDictionaryType,"at:put:",3,0x84,(void *)0x0,
             sysbvm_weakValueDictionary_primitive_atPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).weakValueDictionaryType,"at:",2,0x84,(void *)0x0,
             sysbvm_weakValueDictionary_primitive_at);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"MethodDictionary::new",0,4,(void *)0x0,sysbvm_methodDictionary_primitive_new);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).methodDictionaryType,"atOrNil:",2,0x94,(void *)0x0,
             sysbvm_methodDictionary_primitive_atOrNil);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).methodDictionaryType,"at:",2,0x94,(void *)0x0,
             sysbvm_methodDictionary_primitive_at);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).methodDictionaryType,"at:put:",3,0x94,(void *)0x0,
             sysbvm_methodDictionary_primitive_atPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).methodDictionaryType,"scanFor:",2,0x94,(void *)0x0,
             sysbvm_methodDictionary_primitive_scanFor);
  return;
}

Assistant:

void sysbvm_dictionary_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.dictionaryType, "add:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_dictionary_primitive_add);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.dictionaryType, "atOrNil:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_dictionary_primitive_atOrNil);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.dictionaryType, "at:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_dictionary_primitive_atPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.dictionaryType, "at:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_dictionary_primitive_at);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.dictionaryType, "scanFor:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VIRTUAL , NULL, sysbvm_dictionary_primitive_scanFor);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.identityDictionaryType, "add:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_identityDictionary_primitive_add);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.identityDictionaryType, "associationAtOrNil:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_identityDictionary_primitive_associationAtOrNil);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.identityDictionaryType, "atOrNil:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_identityDictionary_primitive_atOrNil);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.identityDictionaryType, "at:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_identityDictionary_primitive_atPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.identityDictionaryType, "at:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_identityDictionary_primitive_at);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.identityDictionaryType, "scanFor:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_identityDictionary_primitive_scanFor);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.weakValueDictionaryType, "atOrNil:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_weakValueDictionary_primitive_atOrNil);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.weakValueDictionaryType, "at:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_weakValueDictionary_primitive_atPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.weakValueDictionaryType, "at:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_weakValueDictionary_primitive_at);

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "MethodDictionary::new", 0, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_methodDictionary_primitive_new);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.methodDictionaryType, "atOrNil:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_TYPE_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_methodDictionary_primitive_atOrNil);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.methodDictionaryType, "at:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_TYPE_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_methodDictionary_primitive_at);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.methodDictionaryType, "at:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_TYPE_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_methodDictionary_primitive_atPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.methodDictionaryType, "scanFor:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_TYPE_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_methodDictionary_primitive_scanFor);
}